

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O1

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  ulong osize;
  char *pcVar2;
  size_t sVar3;
  
  pMVar1 = ls->buff;
  osize = pMVar1->buffsize;
  if (osize < pMVar1->n + 1) {
    if (0x5555555555555553 < osize) {
      lexerror(ls,"lexical element too long",0);
    }
    sVar3 = (osize >> 1) + osize;
    pcVar2 = (char *)luaM_saferealloc_(ls->L,pMVar1->buffer,osize,sVar3);
    pMVar1->buffer = pcVar2;
    pMVar1->buffsize = sVar3;
  }
  sVar3 = pMVar1->n;
  pMVar1->n = sVar3 + 1;
  pMVar1->buffer[sVar3] = (char)c;
  return;
}

Assistant:

static void save (LexState *ls, int c) {
  Mbuffer *b = ls->buff;
  if (luaZ_bufflen(b) + 1 > luaZ_sizebuffer(b)) {
    size_t newsize = luaZ_sizebuffer(b);  /* get old size */;
    if (newsize >= (MAX_SIZE/3 * 2))  /* larger than MAX_SIZE/1.5 ? */
      lexerror(ls, "lexical element too long", 0);
    newsize += (newsize >> 1);  /* new size is 1.5 times the old one */
    luaZ_resizebuffer(ls->L, b, newsize);
  }
  b->buffer[luaZ_bufflen(b)++] = cast_char(c);
}